

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRGenerator.cc
# Opt level: O1

int __thiscall
flow::lang::IRGenerator::accept(IRGenerator *this,int __fd,sockaddr *__addr,socklen_t *__addr_len)

{
  IRProgram *this_00;
  ConstantValue<long,_(flow::LiteralType)2> *groupId;
  Value *pVVar1;
  Value *extraout_RAX;
  undefined4 in_register_00000034;
  string local_48;
  
  local_48._M_dataplus._M_p = *(pointer *)(CONCAT44(in_register_00000034,__fd) + 0x40);
  this_00 = (this->super_IRBuilder).program_;
  groupId = IRProgram::get<flow::ConstantValue<long,(flow::LiteralType)2>,long>
                      (this_00,&this_00->numbers_,(long *)&local_48);
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"");
  pVVar1 = (Value *)IRBuilder::createRegExpGroup(&this->super_IRBuilder,groupId,&local_48);
  this->result_ = pVVar1;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    pVVar1 = extraout_RAX;
  }
  return (int)pVVar1;
}

Assistant:

void IRGenerator::accept(RegExpGroupExpr& expr) {
  result_ = createRegExpGroup(get(expr.groupId()));
}